

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

void __thiscall Image::drawOnto(Image *this,Image *image,Point point,Point sourcePoint,Size section)

{
  ulong uVar1;
  runtime_error *prVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  allocator<char> local_79 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar9 = section.width;
  if (iVar9 + sourcePoint.x <= (this->size).width) {
    uVar1 = (ulong)sourcePoint >> 0x20;
    iVar3 = section.height;
    if (iVar3 + sourcePoint.y <= (this->size).height) {
      if ((iVar9 + point.x <= (image->size).width) &&
         (uVar7 = (ulong)point >> 0x20, iVar3 + point.y <= (image->size).height)) {
        iVar8 = 0;
        iVar4 = 0;
        if (0 < iVar9) {
          iVar4 = iVar9;
        }
        if (iVar3 == 0 || (long)section < 0) {
          iVar3 = 0;
        }
        while( true ) {
          uVar6 = (ulong)point & 0xffffffff;
          uVar5 = (ulong)sourcePoint & 0xffffffff;
          iVar9 = iVar4;
          if (iVar8 == iVar3) break;
          while( true ) {
            bVar10 = iVar9 == 0;
            iVar9 = iVar9 + -1;
            if (bVar10) break;
            (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_start[(image->size).width * (int)uVar7 + (int)uVar6] =
                 (this->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                 super__Vector_impl_data._M_start[(this->size).width * (int)uVar1 + (int)uVar5];
            uVar5 = (ulong)((int)uVar5 + 1);
            uVar6 = (ulong)((int)uVar6 + 1);
          }
          iVar8 = iVar8 + 1;
          uVar1 = (ulong)((int)uVar1 + 1);
          uVar7 = (ulong)((int)uVar7 + 1);
        }
        return;
      }
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Failed assertion ",local_79);
      std::operator+(&local_50,&local_70,
                     "point.x + section.width <= image.size.width && point.y + section.height <= image.size.height"
                    );
      std::runtime_error::runtime_error(prVar2,(string *)&local_50);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Failed assertion ",local_79);
  std::operator+(&local_50,&local_70,
                 "sourcePoint.x + section.width <= size.width && sourcePoint.y + section.height <= size.height"
                );
  std::runtime_error::runtime_error(prVar2,(string *)&local_50);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::drawOnto(Image &image, Point point, Point sourcePoint, Size section) const {
	throwing_assert(sourcePoint.x + section.width <= size.width && sourcePoint.y + section.height <= size.height);
	throwing_assert(point.x + section.width <= image.size.width && point.y + section.height <= image.size.height);

	for (int y = 0; y < section.height; y++) {
		for (int x = 0; x < section.width; x++) {
			image.pixel(x + point.x, y + point.y) = this->pixel(x + sourcePoint.x, y + sourcePoint.y);
		}
	}
}